

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Input.cpp
# Opt level: O2

bool IsCode(string *ext)

{
  int iVar1;
  size_type sVar2;
  long lVar3;
  undefined1 local_16d;
  undefined1 local_16c;
  undefined1 local_16b;
  allocator local_16a;
  allocator local_169;
  allocator local_168;
  allocator local_167;
  allocator local_166;
  allocator local_165;
  allocator local_164;
  allocator local_163;
  allocator local_162;
  allocator local_161;
  string local_160 [32];
  string local_140 [32];
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  
  if (IsCode(std::__cxx11::string_const&)::exts_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&IsCode(std::__cxx11::string_const&)::exts_abi_cxx11_);
    if (iVar1 != 0) {
      std::__cxx11::string::string(local_160,".c",&local_161);
      std::__cxx11::string::string(local_140,".C",&local_162);
      std::__cxx11::string::string(local_120,".cc",&local_163);
      std::__cxx11::string::string(local_100,".cpp",&local_164);
      std::__cxx11::string::string(local_e0,".m",&local_165);
      std::__cxx11::string::string(local_c0,".mm",&local_166);
      std::__cxx11::string::string(local_a0,".h",&local_167);
      std::__cxx11::string::string(local_80,".H",&local_168);
      std::__cxx11::string::string(local_60,".hpp",&local_169);
      std::__cxx11::string::string(local_40,".hh",&local_16a);
      std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::_Hashtable<std::__cxx11::string_const*>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&IsCode(std::__cxx11::string_const&)::exts_abi_cxx11_,local_160,
                 &stack0xffffffffffffffe0,0,&local_16b,&local_16c,&local_16d);
      lVar3 = 0x120;
      do {
        std::__cxx11::string::~string(local_160 + lVar3);
        lVar3 = lVar3 + -0x20;
      } while (lVar3 != -0x20);
      __cxa_atexit(std::
                   unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::~unordered_set,&IsCode(std::__cxx11::string_const&)::exts_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&IsCode(std::__cxx11::string_const&)::exts_abi_cxx11_);
    }
  }
  sVar2 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&IsCode(std::__cxx11::string_const&)::exts_abi_cxx11_._M_h,ext);
  return sVar2 != 0;
}

Assistant:

static bool IsCode(const std::string &ext) {
    static const std::unordered_set<std::string> exts = { ".c", ".C", ".cc", ".cpp", ".m", ".mm", ".h", ".H", ".hpp", ".hh" };
    return exts.count(ext) > 0;
}